

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode Curl_cf_socket_peek(Curl_cfilter *cf,Curl_easy *data,curl_socket_t *psock,
                            Curl_sockaddr_ex **paddr,ip_quadruple *pip)

{
  Curl_cftype *pCVar1;
  void *pvVar2;
  CURLcode CVar3;
  long lVar4;
  undefined4 *puVar5;
  
  CVar3 = CURLE_FAILED_INIT;
  if (((cf != (Curl_cfilter *)0x0) &&
      ((((pCVar1 = cf->cft, pCVar1 == &Curl_cft_tcp_accept || (pCVar1 == &Curl_cft_unix)) ||
        (pCVar1 == &Curl_cft_tcp)) || (pCVar1 == &Curl_cft_udp)))) &&
     (pvVar2 = cf->ctx, pvVar2 != (void *)0x0)) {
    if (psock != (curl_socket_t *)0x0) {
      *psock = *(curl_socket_t *)((long)pvVar2 + 0x98);
    }
    if (paddr != (Curl_sockaddr_ex **)0x0) {
      *paddr = (Curl_sockaddr_ex *)((long)pvVar2 + 8);
    }
    CVar3 = CURLE_OK;
    if (pip != (ip_quadruple *)0x0) {
      puVar5 = (undefined4 *)((long)pvVar2 + 0x9c);
      for (lVar4 = 0x19; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined4 *)pip->remote_ip = *puVar5;
        puVar5 = puVar5 + 1;
        pip = (ip_quadruple *)(pip->remote_ip + 4);
      }
      return CVar3;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_cf_socket_peek(struct Curl_cfilter *cf,
                             struct Curl_easy *data,
                             curl_socket_t *psock,
                             const struct Curl_sockaddr_ex **paddr,
                             struct ip_quadruple *pip)
{
  (void)data;
  if(cf_is_socket(cf) && cf->ctx) {
    struct cf_socket_ctx *ctx = cf->ctx;

    if(psock)
      *psock = ctx->sock;
    if(paddr)
      *paddr = &ctx->addr;
    if(pip)
      *pip = ctx->ip;
    return CURLE_OK;
  }
  return CURLE_FAILED_INIT;
}